

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O2

void destroy_window_data(SWindowData *window_data)

{
  void *__ptr;
  SWindowData_X11 *window_data_x11;
  
  if (window_data != (SWindowData *)0x0) {
    __ptr = window_data->specific;
    if (__ptr != (void *)0x0) {
      destroy_GL_context(window_data);
      mfb_timer_destroy(*(mfb_timer **)((long)__ptr + 0x30));
      free(__ptr);
    }
    free(window_data);
    return;
  }
  return;
}

Assistant:

void 
destroy_window_data(SWindowData *window_data)  {
    if (window_data != 0x0) {
        if (window_data->specific != 0x0) {
            SWindowData_X11   *window_data_x11 = (SWindowData_X11 *) window_data->specific;

#if defined(USE_OPENGL_API)            
            destroy_GL_context(window_data);
#else
            if (window_data_x11->image != 0x0) {
                window_data_x11->image->data = 0x0;
                XDestroyImage(window_data_x11->image);
                XDestroyWindow(window_data_x11->display, window_data_x11->window);
                XCloseDisplay(window_data_x11->display);
            }
#endif            

            mfb_timer_destroy(window_data_x11->timer);
            memset(window_data_x11, 0, sizeof(SWindowData_X11));
            free(window_data_x11);
        }
        memset(window_data, 0, sizeof(SWindowData));
        free(window_data);
    }
}